

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void handle_div(DisasContext_conflict1 *s,_Bool is_signed,uint sf,uint rm,uint rn,uint rd)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_i64 retval;
  TCGv_i64 pTVar1;
  TCGv_i64 tcg_rd;
  TCGv_i64 tcg_m;
  TCGv_i64 tcg_n;
  TCGContext_conflict1 *tcg_ctx;
  uint rd_local;
  uint rn_local;
  uint rm_local;
  uint sf_local;
  _Bool is_signed_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  retval = cpu_reg_aarch64(s,rd);
  if ((sf == 0) && (is_signed)) {
    tcg_m = new_tmp_a64_aarch64(s);
    tcg_rd = new_tmp_a64_aarch64(s);
    pTVar1 = cpu_reg_aarch64(s,rn);
    tcg_gen_ext32s_i64_aarch64(tcg_ctx_00,tcg_m,pTVar1);
    pTVar1 = cpu_reg_aarch64(s,rm);
    tcg_gen_ext32s_i64_aarch64(tcg_ctx_00,tcg_rd,pTVar1);
  }
  else {
    tcg_m = read_cpu_reg_aarch64(s,rn,sf);
    tcg_rd = read_cpu_reg_aarch64(s,rm,sf);
  }
  if (is_signed) {
    gen_helper_sdiv64(tcg_ctx_00,retval,tcg_m,tcg_rd);
  }
  else {
    gen_helper_udiv64(tcg_ctx_00,retval,tcg_m,tcg_rd);
  }
  if (sf == 0) {
    tcg_gen_ext32u_i64_aarch64(tcg_ctx_00,retval,retval);
  }
  return;
}

Assistant:

static void handle_div(DisasContext *s, bool is_signed, unsigned int sf,
                       unsigned int rm, unsigned int rn, unsigned int rd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 tcg_n, tcg_m, tcg_rd;
    tcg_rd = cpu_reg(s, rd);

    if (!sf && is_signed) {
        tcg_n = new_tmp_a64(s);
        tcg_m = new_tmp_a64(s);
        tcg_gen_ext32s_i64(tcg_ctx, tcg_n, cpu_reg(s, rn));
        tcg_gen_ext32s_i64(tcg_ctx, tcg_m, cpu_reg(s, rm));
    } else {
        tcg_n = read_cpu_reg(s, rn, sf);
        tcg_m = read_cpu_reg(s, rm, sf);
    }

    if (is_signed) {
        gen_helper_sdiv64(tcg_ctx, tcg_rd, tcg_n, tcg_m);
    } else {
        gen_helper_udiv64(tcg_ctx, tcg_rd, tcg_n, tcg_m);
    }

    if (!sf) { /* zero extend final result */
        tcg_gen_ext32u_i64(tcg_ctx, tcg_rd, tcg_rd);
    }
}